

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.h
# Opt level: O2

void __thiscall r_exec::StructureValue::~StructureValue(StructureValue *this)

{
  ~StructureValue(this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT StructureValue:
    public BoundValue
{
private:
    core::P<r_code::Code> structure;
    StructureValue(BindingMap *map, const r_code::Code *structure);
public:
    StructureValue(BindingMap *map, const r_code::Code *source, uint16_t structure_index);
    StructureValue(BindingMap *map, r_code::Atom *source, uint16_t structure_index);
    StructureValue(BindingMap *map, uint64_t time);

    Value *copy(BindingMap *map) const;
    void valuate(r_code::Code *destination, uint16_t write_index, uint16_t &extent_index) const;
    bool match(const r_code::Code *object, uint16_t index);
    r_code::Atom *get_code();
    r_code::Code *get_object();
    uint16_t get_code_size();

    bool intersect(const Value *v) const;
    bool _intersect(const StructureValue *v) const;

    bool contains(const r_code::Atom *s) const;
}